

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> local_38;
  ostream_type *local_20;
  char *pcStack_18;
  
  local_38._M_stream = it->_M_stream;
  local_38._M_string = it->_M_string;
  internal::
  format_uint<3u,char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long>
            ((internal *)&local_20,&local_38,*(unsigned_long *)this,*(int *)(this + 8),false);
  it->_M_stream = local_20;
  it->_M_string = pcStack_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }